

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_23::Struct2Local::adjustTypeFlowingThrough(Struct2Local *this,Expression *curr)

{
  ulong uVar1;
  __node_ptr p_Var2;
  HeapType HVar3;
  __hash_code __code;
  Expression *local_18;
  
  local_18 = curr;
  p_Var2 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&(this->analyzer->reachedInteractions)._M_h,
                          (ulong)curr % (this->analyzer->reachedInteractions)._M_h._M_bucket_count,
                          &local_18,(__hash_code)&local_18);
  if ((p_Var2 != (__node_ptr)0x0) &&
     ((p_Var2->
      super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
      ).
      super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
      ._M_storage._M_storage.__data[8] == '\x02')) {
    uVar1 = (curr->type).id;
    if ((uVar1 < 7) || ((uVar1 & 1) != 0)) {
      __assert_fail("curr->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x27d,
                    "void wasm::(anonymous namespace)::Struct2Local::adjustTypeFlowingThrough(Expression *)"
                   );
    }
    HVar3 = wasm::Type::getHeapType(&curr->type);
    if (((uint)(0x7c < HVar3.id) * 4 + 3 & (uint)HVar3.id) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    (curr->type).id = HVar3.id | 2;
  }
  return;
}

Assistant:

void adjustTypeFlowingThrough(Expression* curr) {
    if (analyzer.getInteraction(curr) != ParentChildInteraction::Flows) {
      return;
    }

    // Our allocation passes through this expr. We must turn its type into a
    // nullable one, because we will remove things like RefAsNonNull of it,
    // which means we may no longer have a non-nullable value as our input,
    // and we could fail to validate. It is safe to make this change in terms
    // of our parent, since we know very specifically that only safe things
    // will end up using our value, like a StructGet or a Drop, which do not
    // care about non-nullability.
    assert(curr->type.isRef());
    curr->type = Type(curr->type.getHeapType(), Nullable);
  }